

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderControlStatementTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Performance::ShaderControlStatementTests::init
          (ShaderControlStatementTests *this,EVP_PKEY_CTX *ctx)

{
  WorkloadDivision workloadDivision;
  TestNode *node;
  ShaderPerformanceCaseGroup *this_00;
  ConditionalCase *this_01;
  char *__rhs;
  BranchResult branchType;
  char *__rhs_00;
  DecisionType decisionType;
  char *local_100;
  allocator<char> aStack_f1;
  undefined8 local_f0;
  char *local_e8;
  ShaderControlStatementTests *local_e0;
  TestNode *local_d8;
  string caseName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_50;
  
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"if_else",
             "if-else Conditional Performance Tests");
  tcu::TestNode::addChild((TestNode *)this,node);
  local_e0 = this;
  local_d8 = node;
  this_00 = (ShaderPerformanceCaseGroup *)operator_new(0x80);
  deqp::gls::ShaderPerformanceCaseGroup::ShaderPerformanceCaseGroup
            (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "vertex","");
  tcu::TestNode::addChild(node,(TestNode *)this_00);
  local_f0 = 0;
  local_e8 = "attribute";
  decisionType = DECISION_STATIC;
  local_100 = "static";
  do {
    for (workloadDivision = WORKLOAD_DIVISION_EVEN; workloadDivision != WORKLOAD_DIVISION_LAST;
        workloadDivision = workloadDivision + WORKLOAD_DIVISION_TRUE_HEAVY) {
      __rhs_00 = "_with_heavier_false";
      if (workloadDivision == WORKLOAD_DIVISION_TRUE_HEAVY) {
        __rhs_00 = "_with_heavier_true";
      }
      if (workloadDivision == WORKLOAD_DIVISION_EVEN) {
        __rhs_00 = "";
      }
      for (branchType = BRANCH_TRUE; branchType != BRANCH_LAST;
          branchType = branchType + BRANCH_FALSE) {
        if (decisionType == DECISION_ATTRIBUTE || branchType != BRANCH_MIXED) {
          __rhs = "true";
          if (branchType != BRANCH_TRUE) {
            if (branchType == BRANCH_FALSE) {
              __rhs = "false";
            }
            else {
              __rhs = (char *)0x0;
              if (branchType == BRANCH_MIXED) {
                __rhs = "mixed";
              }
            }
          }
          std::__cxx11::string::string<std::allocator<char>>((string *)&bStack_70,"",&aStack_f1);
          std::operator+(&bStack_50,&bStack_70,local_100);
          std::operator+(&bStack_90,&bStack_50,"_");
          std::operator+(&bStack_b0,&bStack_90,__rhs);
          std::operator+(&caseName,&bStack_b0,__rhs_00);
          std::__cxx11::string::~string((string *)&bStack_b0);
          std::__cxx11::string::~string((string *)&bStack_90);
          std::__cxx11::string::~string((string *)&bStack_50);
          std::__cxx11::string::~string((string *)&bStack_70);
          this_01 = (ConditionalCase *)operator_new(0x1f0);
          ConditionalCase::ConditionalCase
                    (this_01,(local_e0->super_TestCaseGroup).m_context,caseName._M_dataplus._M_p,"",
                     decisionType,branchType,workloadDivision,(int)local_f0 == 0);
          deqp::gls::ShaderPerformanceCaseGroup::addChild(this_00,(ShaderPerformanceCase *)this_01);
          std::__cxx11::string::~string((string *)&caseName);
        }
      }
    }
    decisionType = decisionType + DECISION_UNIFORM;
    local_100 = "uniform";
  } while( true );
}

Assistant:

void ShaderControlStatementTests::init (void)
{
	// Conditional cases (if-else).

	tcu::TestCaseGroup* ifElseGroup = new tcu::TestCaseGroup(m_testCtx, "if_else", "if-else Conditional Performance Tests");
	addChild(ifElseGroup);

	for (int isFrag = 0; isFrag <= 1; isFrag++)
	{
		bool isVertex = isFrag == 0;
		ShaderPerformanceCaseGroup* vertexOrFragmentGroup = new ShaderPerformanceCaseGroup(m_testCtx, isVertex ? "vertex" : "fragment", "");
		ifElseGroup->addChild(vertexOrFragmentGroup);

		DE_STATIC_ASSERT(DECISION_STATIC == 0);
		for (int decisionType = (int)DECISION_STATIC; decisionType < (int)DECISION_LAST; decisionType++)
		{
			const char* decisionName = decisionType == (int)DECISION_STATIC		? "static" :
										decisionType == (int)DECISION_UNIFORM	? "uniform" :
										decisionType == (int)DECISION_ATTRIBUTE	? (isVertex ? "attribute" : "varying") :
																					DE_NULL;
			DE_ASSERT(decisionName != DE_NULL);

			for (int workloadDivision = 0; workloadDivision < ConditionalCase::WORKLOAD_DIVISION_LAST; workloadDivision++)
			{
				const char* workloadDivisionSuffix = workloadDivision == (int)ConditionalCase::WORKLOAD_DIVISION_EVEN			? "" :
													 workloadDivision == (int)ConditionalCase::WORKLOAD_DIVISION_TRUE_HEAVY		? "_with_heavier_true" :
													 workloadDivision == (int)ConditionalCase::WORKLOAD_DIVISION_FALSE_HEAVY	? "_with_heavier_false" :
																																  DE_NULL;
				DE_ASSERT(workloadDivisionSuffix != DE_NULL);

				DE_STATIC_ASSERT(ConditionalCase::BRANCH_TRUE == 0);
				for (int branchResult = (int)ConditionalCase::BRANCH_TRUE; branchResult < (int)ConditionalCase::BRANCH_LAST; branchResult++)
				{
					if (decisionType != (int)DECISION_ATTRIBUTE && branchResult == (int)ConditionalCase::BRANCH_MIXED)
						continue;

					const char* branchResultName = branchResult == (int)ConditionalCase::BRANCH_TRUE	? "true" :
												   branchResult == (int)ConditionalCase::BRANCH_FALSE	? "false" :
												   branchResult == (int)ConditionalCase::BRANCH_MIXED	? "mixed" :
																										  DE_NULL;
					DE_ASSERT(branchResultName != DE_NULL);

					string caseName = string("") + decisionName + "_" + branchResultName + workloadDivisionSuffix;

					vertexOrFragmentGroup->addChild(new ConditionalCase(m_context, caseName.c_str(), "",
																		(DecisionType)decisionType, (ConditionalCase::BranchResult)branchResult,
																		(ConditionalCase::WorkloadDivision)workloadDivision, isVertex));
				}
			}
		}

		if (isVertex)
			vertexOrFragmentGroup->addChild(new ConditionalWorkloadReferenceCase(m_context, "reference", "", true, isVertex));
		else
		{
			// Only fragment case with BRANCH_MIXED has an additional fract() call.
			vertexOrFragmentGroup->addChild(new ConditionalWorkloadReferenceCase(m_context, "reference_unmixed", "", true, isVertex));
			vertexOrFragmentGroup->addChild(new ConditionalWorkloadReferenceCase(m_context, "reference_mixed", "", false, isVertex));
		}

		vertexOrFragmentGroup->addChild(new EmptyWorkloadReferenceCase(m_context, "reference_empty", "", isVertex));
	}

	// Loop cases.

	static const struct
	{
		LoopCase::LoopType	type;
		const char*			name;
		const char*			description;
	} loopGroups[] =
	{
		{LoopCase::LOOP_FOR,		"for",		"for Loop Performance Tests"},
		{LoopCase::LOOP_WHILE,		"while",	"while Loop Performance Tests"},
		{LoopCase::LOOP_DO_WHILE,	"do_while",	"do-while Loop Performance Tests"}
	};

	for (int groupNdx = 0; groupNdx < DE_LENGTH_OF_ARRAY(loopGroups); groupNdx++)
	{
		tcu::TestCaseGroup* currentLoopGroup = new tcu::TestCaseGroup(m_testCtx, loopGroups[groupNdx].name, loopGroups[groupNdx].description);
		addChild(currentLoopGroup);

		for (int isFrag = 0; isFrag <= 1; isFrag++)
		{
			bool isVertex = isFrag == 0;
			ShaderPerformanceCaseGroup* vertexOrFragmentGroup = new ShaderPerformanceCaseGroup(m_testCtx, isVertex ? "vertex" : "fragment", "");
			currentLoopGroup->addChild(vertexOrFragmentGroup);

			DE_STATIC_ASSERT(DECISION_STATIC == 0);
			for (int decisionType = (int)DECISION_STATIC; decisionType < (int)DECISION_LAST; decisionType++)
			{
				const char* decisionName = decisionType == (int)DECISION_STATIC		? "static" :
										   decisionType == (int)DECISION_UNIFORM	? "uniform" :
										   decisionType == (int)DECISION_ATTRIBUTE	? (isVertex ? "attribute" : "varying") :
																					  DE_NULL;
				DE_ASSERT(decisionName != DE_NULL);

				if (decisionType == (int)DECISION_ATTRIBUTE)
				{
					vertexOrFragmentGroup->addChild(new LoopCase(m_context, (string(decisionName) + "_stable").c_str(), "", loopGroups[groupNdx].type, (DecisionType)decisionType, true, isVertex));
					vertexOrFragmentGroup->addChild(new LoopCase(m_context, (string(decisionName) + "_unstable").c_str(), "", loopGroups[groupNdx].type, (DecisionType)decisionType, false, isVertex));
				}
				else
					vertexOrFragmentGroup->addChild(new LoopCase(m_context, decisionName, "", loopGroups[groupNdx].type, (DecisionType)decisionType, true, isVertex));

			}

			if (isVertex)
				vertexOrFragmentGroup->addChild(new LoopWorkloadReferenceCase(m_context, "reference", "", true, isVertex));
			else
			{
				// Only fragment case with unstable attribute has an additional fract() call.
				vertexOrFragmentGroup->addChild(new LoopWorkloadReferenceCase(m_context, "reference_stable", "", true, isVertex));
				vertexOrFragmentGroup->addChild(new LoopWorkloadReferenceCase(m_context, "reference_unstable", "", false, isVertex));
			}
		}
	}
}